

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O1

void test_linear_hash_increment_buckets(planck_unit_test_t *tc)

{
  int iVar1;
  planck_unit_result_t pVar2;
  int iVar3;
  linear_hash_table_t *linear_hash;
  int iVar4;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  linear_hash = (linear_hash_table_t *)malloc(0x78);
  iVar4 = 0;
  test_linear_hash_create(tc,linear_hash,key_type_numeric_signed,4,4,4);
  iVar1 = linear_hash->num_buckets;
  iVar3 = linear_hash->records_per_bucket * iVar1 * linear_hash->split_threshold;
  if (99 < iVar3) {
    do {
      local_3c = 0x11;
      local_40 = 0x13;
      test_linear_hash_insert(tc,&local_3c,&local_40,'\0',1,'\x01',linear_hash);
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(iVar1 == linear_hash->num_buckets),0x11e,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                         ,"condition was false, expected true");
      if (pVar2 == '\0') goto LAB_00101bc5;
      iVar4 = iVar4 + 1;
    } while (iVar4 < iVar3 / 100);
  }
  local_34 = 0x11;
  local_38 = 0x13;
  test_linear_hash_insert(tc,&local_34,&local_38,'\0',1,'\x01',linear_hash);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 + 1 == linear_hash->num_buckets),0x123,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  if (pVar2 != '\0') {
    test_linear_hash_destroy(tc,linear_hash);
    return;
  }
LAB_00101bc5:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_linear_hash_increment_buckets(
	planck_unit_test_t *tc
) {
	linear_hash_table_t *linear_hash = malloc(sizeof(linear_hash_table_t));

	test_linear_hash_setup(tc, linear_hash);

	double split_cardinality	= linear_hash->records_per_bucket * linear_hash->num_buckets * linear_hash->split_threshold / 100;

	int original_number_buckets = linear_hash->num_buckets;
	int i;

	/* test while inserting to reach threshold - linear_hash.num_buckets should not change over this range */
	for (i = 0; i < split_cardinality; i++) {
		test_linear_hash_insert(tc, IONIZE(17, int), IONIZE(19, int), err_ok, 1, boolean_true, linear_hash);
		PLANCK_UNIT_ASSERT_TRUE(tc, original_number_buckets == linear_hash->num_buckets);
	}

	/* test inserting push above threshold - linear_hash.num_buckets should increase by one */
	test_linear_hash_insert(tc, IONIZE(17, int), IONIZE(19, int), err_ok, 1, boolean_true, linear_hash);
	PLANCK_UNIT_ASSERT_TRUE(tc, original_number_buckets + 1 == linear_hash->num_buckets);

	test_linear_hash_takedown(tc, linear_hash);
}